

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O0

int x509v3_looks_like_dns_name(uchar *in,size_t len)

{
  byte bVar1;
  int iVar2;
  ulong uStack_30;
  uchar c;
  size_t i;
  size_t label_start;
  size_t len_local;
  uchar *in_local;
  
  label_start = len;
  if ((len != 0) && (in[len - 1] == '.')) {
    label_start = len - 1;
  }
  len_local = (size_t)in;
  if (((1 < label_start) && (*in == '*')) && (in[1] == '.')) {
    len_local = (size_t)(in + 2);
    label_start = label_start - 2;
  }
  if (label_start == 0) {
    in_local._4_4_ = 0;
  }
  else {
    i = 0;
    for (uStack_30 = 0; uStack_30 < label_start; uStack_30 = uStack_30 + 1) {
      bVar1 = *(byte *)(len_local + uStack_30);
      iVar2 = OPENSSL_isalnum((uint)bVar1);
      if (((iVar2 == 0) && ((bVar1 != 0x2d || (uStack_30 <= i)))) &&
         ((bVar1 != 0x5f && (bVar1 != 0x3a)))) {
        if (((bVar1 != 0x2e) || (uStack_30 <= i)) || (label_start - 1 <= uStack_30)) {
          return 0;
        }
        i = uStack_30 + 1;
      }
    }
    in_local._4_4_ = 1;
  }
  return in_local._4_4_;
}

Assistant:

int x509v3_looks_like_dns_name(const unsigned char *in, size_t len) {
  // This function is used as a heuristic for whether a common name is a
  // hostname to be matched, or merely a decorative name to describe the
  // subject. This heuristic must be applied to both name constraints and the
  // common name fallback, so it must be loose enough to accept hostname
  // common names, and tight enough to reject decorative common names.

  if (len > 0 && in[len - 1] == '.') {
    len--;
  }

  // Wildcards are allowed in front.
  if (len >= 2 && in[0] == '*' && in[1] == '.') {
    in += 2;
    len -= 2;
  }

  if (len == 0) {
    return 0;
  }

  size_t label_start = 0;
  for (size_t i = 0; i < len; i++) {
    unsigned char c = in[i];
    if (OPENSSL_isalnum(c) || (c == '-' && i > label_start) ||
        // These are not valid characters in hostnames, but commonly found
        // in deployments outside the Web PKI.
        c == '_' || c == ':') {
      continue;
    }

    // Labels must not be empty.
    if (c == '.' && i > label_start && i < len - 1) {
      label_start = i + 1;
      continue;
    }

    return 0;
  }

  return 1;
}